

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall BackwardPass::DeadStoreTypeCheckBailOut(BackwardPass *this,Instr *instr)

{
  code *pcVar1;
  PropertySymOpnd *propertySymOpnd_00;
  Instr *pIVar2;
  bool bVar3;
  BailOutKind e1;
  BailOutKind BVar4;
  undefined4 *puVar5;
  Opnd *pOVar6;
  SymOpnd *pSVar7;
  PropertySymOpnd *pPVar8;
  BailOutInfo *pBVar9;
  PropertySymOpnd *local_48;
  BailOutKind local_30;
  BailOutKind newBailOutKind;
  BailOutKind bailOutKind;
  bool isTypeCheckProtected;
  PropertySymOpnd *propertySymOpnd;
  Instr *pIStack_18;
  BailOutKind oldBailOutKind;
  Instr *instr_local;
  BackwardPass *this_local;
  
  pIStack_18 = instr;
  instr_local = (Instr *)this;
  if (this->tag != DeadStorePhase) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x8e0,"(this->tag == Js::DeadStorePhase)","this->tag == Js::DeadStorePhase")
    ;
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar3 = IsPrePass(this);
  if (bVar3) {
    return;
  }
  bVar3 = IR::Instr::HasBailOutInfo(pIStack_18);
  if (!bVar3) {
    return;
  }
  pOVar6 = IR::Instr::GetDst(pIStack_18);
  if (pOVar6 != (Opnd *)0x0) {
    pOVar6 = IR::Instr::GetDst(pIStack_18);
    bVar3 = IR::Opnd::IsSymOpnd(pOVar6);
    if (bVar3) {
      return;
    }
  }
  propertySymOpnd._4_4_ = IR::Instr::GetBailOutKind(pIStack_18);
  bVar3 = IR::IsTypeCheckBailOutKind(propertySymOpnd._4_4_);
  if (!bVar3) {
    return;
  }
  pOVar6 = IR::Instr::GetSrc1(pIStack_18);
  if (pOVar6 == (Opnd *)0x0) {
LAB_004d1554:
    pOVar6 = IR::Instr::GetDst(pIStack_18);
    if (pOVar6 != (Opnd *)0x0) {
      pOVar6 = IR::Instr::GetDst(pIStack_18);
      bVar3 = IR::Opnd::IsSymOpnd(pOVar6);
      if (bVar3) {
        pOVar6 = IR::Instr::GetDst(pIStack_18);
        pSVar7 = IR::Opnd::AsSymOpnd(pOVar6);
        bVar3 = IR::SymOpnd::IsPropertySymOpnd(pSVar7);
        if (bVar3) goto LAB_004d1602;
      }
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x8f6,
                       "((instr->GetSrc1() && instr->GetSrc1()->IsSymOpnd() && instr->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd()) || (instr->GetDst() && instr->GetDst()->IsSymOpnd() && instr->GetDst()->AsSymOpnd()->IsPropertySymOpnd()))"
                       ,
                       "(instr->GetSrc1() && instr->GetSrc1()->IsSymOpnd() && instr->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd()) || (instr->GetDst() && instr->GetDst()->IsSymOpnd() && instr->GetDst()->AsSymOpnd()->IsPropertySymOpnd())"
                      );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  else {
    pOVar6 = IR::Instr::GetSrc1(pIStack_18);
    bVar3 = IR::Opnd::IsSymOpnd(pOVar6);
    if (!bVar3) goto LAB_004d1554;
    pOVar6 = IR::Instr::GetSrc1(pIStack_18);
    pSVar7 = IR::Opnd::AsSymOpnd(pOVar6);
    bVar3 = IR::SymOpnd::IsPropertySymOpnd(pSVar7);
    if (!bVar3) goto LAB_004d1554;
  }
LAB_004d1602:
  pOVar6 = IR::Instr::GetDst(pIStack_18);
  if (pOVar6 != (Opnd *)0x0) {
    pOVar6 = IR::Instr::GetDst(pIStack_18);
    bVar3 = IR::Opnd::IsSymOpnd(pOVar6);
    if (bVar3) {
      pOVar6 = IR::Instr::GetDst(pIStack_18);
      local_48 = IR::Opnd::AsPropertySymOpnd(pOVar6);
      goto LAB_004d1656;
    }
  }
  pOVar6 = IR::Instr::GetSrc1(pIStack_18);
  local_48 = IR::Opnd::AsPropertySymOpnd(pOVar6);
LAB_004d1656:
  _bailOutKind = local_48;
  bVar3 = IR::PropertySymOpnd::TypeCheckRequired(local_48);
  pIVar2 = pIStack_18;
  propertySymOpnd_00 = _bailOutKind;
  if (!bVar3) {
    newBailOutKind._3_1_ = BailOutInvalid >> 0x18;
    pPVar8 = (PropertySymOpnd *)IR::Instr::GetDst(pIStack_18);
    bVar3 = GlobOpt::NeedsTypeCheckBailOut
                      (pIVar2,propertySymOpnd_00,propertySymOpnd_00 == pPVar8,
                       (bool *)((long)&newBailOutKind + 3),&local_30);
    BVar4 = propertySymOpnd._4_4_;
    if (bVar3) {
      e1 = IR::operator~(BailOutKindBits);
      BVar4 = IR::operator&(BVar4,e1);
      if (((BVar4 != local_30) && (local_30 != BailOutFailedFixedFieldTypeCheck)) &&
         (local_30 != BailOutFailedEquivalentFixedFieldTypeCheck)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x908,
                           "((oldBailOutKind & ~IR::BailOutKindBits) == bailOutKind || bailOutKind == IR::BailOutFailedFixedFieldTypeCheck || bailOutKind == IR::BailOutFailedEquivalentFixedFieldTypeCheck)"
                           ,
                           "(oldBailOutKind & ~IR::BailOutKindBits) == bailOutKind || bailOutKind == IR::BailOutFailedFixedFieldTypeCheck || bailOutKind == IR::BailOutFailedEquivalentFixedFieldTypeCheck"
                          );
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      IR::Instr::SetBailOutKind(pIStack_18,local_30);
    }
    else if ((newBailOutKind._3_1_ & BailOutLocalValueChanged >> 0x18) == BailOutInvalid >> 0x18) {
      bVar3 = IR::PropertySymOpnd::IsTypeCheckProtected(_bailOutKind);
      if (bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x916,"(!propertySymOpnd->IsTypeCheckProtected())",
                           "!propertySymOpnd->IsTypeCheckProtected()");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      if (pIStack_18->m_opcode == CheckObjType) {
        pOVar6 = IR::Instr::GetDst(pIStack_18);
        if (((pOVar6 != (Opnd *)0x0) ||
            (pOVar6 = IR::Instr::GetSrc1(pIStack_18), pOVar6 == (Opnd *)0x0)) ||
           (pOVar6 = IR::Instr::GetSrc2(pIStack_18), pOVar6 != (Opnd *)0x0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x91d,
                             "(instr->GetDst() == nullptr && instr->GetSrc1() != nullptr && instr->GetSrc2() == nullptr)"
                             ,
                             "instr->GetDst() == nullptr && instr->GetSrc1() != nullptr && instr->GetSrc2() == nullptr"
                            );
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        pIStack_18->m_opcode = Nop;
        IR::Instr::FreeSrc1(pIStack_18);
        IR::Instr::ClearBailOutInfo(pIStack_18);
        if (this->preOpBailOutInstrToProcess == pIStack_18) {
          this->preOpBailOutInstrToProcess = (Instr *)0x0;
        }
      }
      else {
        bVar3 = BasicBlock::IsLandingPad(this->currentBlock);
        if (bVar3) {
          if (this->preOpBailOutInstrToProcess == pIStack_18) {
            this->preOpBailOutInstrToProcess = (Instr *)0x0;
          }
          IR::Instr::UnlinkBailOutInfo(pIStack_18);
        }
        else if ((local_30 != BailOutFailedEquivalentTypeCheck) &&
                (local_30 != BailOutFailedEquivalentFixedFieldTypeCheck)) {
          pBVar9 = IR::Instr::GetBailOutInfo(pIStack_18);
          pBVar9->polymorphicCacheIndex = 0xffffffff;
          BVar4 = IR::operator&(propertySymOpnd._4_4_,BailOutMarkTempObject);
          BVar4 = IR::operator|(BailOutOnImplicitCallsPreOp,BVar4);
          bVar3 = BailOutInfo::HasLazyBailOut(propertySymOpnd._4_4_);
          pIVar2 = pIStack_18;
          if (bVar3) {
            BVar4 = BailOutInfo::WithLazyBailOut(BVar4);
            IR::Instr::SetBailOutKind(pIVar2,BVar4);
          }
          else {
            IR::Instr::SetBailOutKind(pIStack_18,BVar4);
          }
        }
      }
    }
    else {
      IR::Instr::ClearBailOutInfo(pIStack_18);
      if (this->preOpBailOutInstrToProcess == pIStack_18) {
        this->preOpBailOutInstrToProcess = (Instr *)0x0;
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::DeadStoreTypeCheckBailOut(IR::Instr * instr)
{
    // Good news: There are cases where the forward pass installs BailOutFailedTypeCheck, but the dead store pass
    // discovers that the checked type is dead.
    // Bad news: We may still need implicit call bailout, and it's up to the dead store pass to figure this out.
    // Worse news: BailOutFailedTypeCheck is pre-op, and BailOutOnImplicitCall is post-op. We'll use a special
    // bailout kind to indicate implicit call bailout that targets its own instruction. The lowerer will emit
    // code to disable/re-enable implicit calls around the operation.

    Assert(this->tag == Js::DeadStorePhase);

    if (this->IsPrePass() || !instr->HasBailOutInfo())
    {
        return;
    }

    // By default, do not do this for stores, as it makes the presence of type checks unpredictable in the forward pass.
    // For instance, we can't predict which stores may cause reallocation of aux slots.
    if (instr->GetDst() && instr->GetDst()->IsSymOpnd())
    {
        return;
    }

    const IR::BailOutKind oldBailOutKind = instr->GetBailOutKind();
    if (!IR::IsTypeCheckBailOutKind(oldBailOutKind))
    {
        return;
    }

    // Either src1 or dst must be a property sym operand
    Assert((instr->GetSrc1() && instr->GetSrc1()->IsSymOpnd() && instr->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd()) ||
        (instr->GetDst() && instr->GetDst()->IsSymOpnd() && instr->GetDst()->AsSymOpnd()->IsPropertySymOpnd()));

    IR::PropertySymOpnd *propertySymOpnd =
        (instr->GetDst() && instr->GetDst()->IsSymOpnd()) ? instr->GetDst()->AsPropertySymOpnd() : instr->GetSrc1()->AsPropertySymOpnd();

    if (propertySymOpnd->TypeCheckRequired())
    {
        return;
    }

    bool isTypeCheckProtected = false;
    IR::BailOutKind bailOutKind;
    if (GlobOpt::NeedsTypeCheckBailOut(instr, propertySymOpnd, propertySymOpnd == instr->GetDst(), &isTypeCheckProtected, &bailOutKind))
    {
        // If we installed a failed type check bailout in the forward pass, but we are now discovering that the checked
        // type is dead, we may still need a bailout on failed fixed field type check. These type checks are required
        // regardless of whether the checked type is dead.  Hence, the bailout kind may change here.
        Assert((oldBailOutKind & ~IR::BailOutKindBits) == bailOutKind ||
            bailOutKind == IR::BailOutFailedFixedFieldTypeCheck || bailOutKind == IR::BailOutFailedEquivalentFixedFieldTypeCheck);
        instr->SetBailOutKind(bailOutKind);
        return;
    }
    else if (isTypeCheckProtected)
    {
        instr->ClearBailOutInfo();
        if (preOpBailOutInstrToProcess == instr)
        {
            preOpBailOutInstrToProcess = nullptr;
        }
        return;
    }

    Assert(!propertySymOpnd->IsTypeCheckProtected());

    // If all we're doing here is checking the type (e.g. because we've hoisted a field load or store out of the loop, but needed
    // the type check to remain in the loop), and now it turns out we don't need the type checked, we can simply turn this into
    // a NOP and remove the bailout.
    if (instr->m_opcode == Js::OpCode::CheckObjType)
    {
        Assert(instr->GetDst() == nullptr && instr->GetSrc1() != nullptr && instr->GetSrc2() == nullptr);
        instr->m_opcode = Js::OpCode::Nop;
        instr->FreeSrc1();
        instr->ClearBailOutInfo();
        if (this->preOpBailOutInstrToProcess == instr)
        {
            this->preOpBailOutInstrToProcess = nullptr;
        }
        return;
    }

    // We don't need BailOutFailedTypeCheck but may need BailOutOnImplicitCall.
    // Consider: are we in the loop landing pad? If so, no bailout, since implicit calls will be checked at
    // the end of the block.
    if (this->currentBlock->IsLandingPad())
    {
        // We're in the landing pad.
        if (preOpBailOutInstrToProcess == instr)
        {
            preOpBailOutInstrToProcess = nullptr;
        }
        instr->UnlinkBailOutInfo();
        return;
    }

    // If bailOutKind is equivTypeCheck then leave alone the bailout
    if (bailOutKind == IR::BailOutFailedEquivalentTypeCheck ||
        bailOutKind == IR::BailOutFailedEquivalentFixedFieldTypeCheck)
    {
        return;
    }

    // We're not checking for polymorphism, so don't let the bailout indicate that we
    // detected polymorphism.
    instr->GetBailOutInfo()->polymorphicCacheIndex = (uint)-1;

    // Keep the mark temp object bit if it is there so that we will not remove the implicit call check
    IR::BailOutKind newBailOutKind = IR::BailOutOnImplicitCallsPreOp | (oldBailOutKind & IR::BailOutMarkTempObject);
    if (BailOutInfo::HasLazyBailOut(oldBailOutKind))
    {
        instr->SetBailOutKind(BailOutInfo::WithLazyBailOut(newBailOutKind));
    }
    else
    {
        instr->SetBailOutKind(newBailOutKind);
    }
}